

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

bool __thiscall TPZFMatrix<float>::Compare(TPZFMatrix<float> *this,TPZSavable *copy,bool override)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  TPZFMatrix<float> *this_00;
  TPZFMatrix<float> *A;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  double dVar6;
  stringstream sout;
  float exp;
  int64_t iel;
  int64_t numdif;
  float diff;
  int64_t nel;
  bool matresult;
  TPZFMatrix<float> *fmat;
  long local_228;
  string local_210 [48];
  stringstream local_1e0 [16];
  ostream local_1d0 [367];
  undefined1 in_stack_ffffffffffffff9f;
  TPZSavable *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  long local_50;
  long local_48;
  float local_3c;
  bool local_29;
  bool local_1;
  
  if (in_RSI == 0) {
    local_228 = 0;
  }
  else {
    local_228 = __dynamic_cast(in_RSI,&TPZSavable::typeinfo,&typeinfo,0);
  }
  if (local_228 == 0) {
    local_1 = false;
  }
  else {
    local_29 = TPZMatrix<float>::Compare
                         ((TPZMatrix<float> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
    lVar3 = *(long *)(in_RDI + 8);
    lVar4 = *(long *)(in_RDI + 0x10);
    local_3c = 0.0;
    local_48 = 0;
    for (local_50 = 0; local_50 < lVar3 * lVar4; local_50 = local_50 + 1) {
      fVar2 = *(float *)(*(long *)(in_RDI + 0x20) + local_50 * 4);
      pfVar1 = (float *)(*(long *)(local_228 + 0x20) + local_50 * 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        local_29 = false;
        local_48 = local_48 + 1;
      }
      dVar6 = std::fabs((double)(ulong)(uint)(*(float *)(*(long *)(in_RDI + 0x20) + local_50 * 4) -
                                             *(float *)(*(long *)(local_228 + 0x20) + local_50 * 4))
                       );
      local_3c = SUB84(dVar6,0) + local_3c;
    }
    if (local_29 == false) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      poVar5 = std::operator<<(local_1d0,
                               "virtual bool TPZFMatrix<float>::Compare(TPZSavable *, bool) [TVar = float]"
                              );
      std::operator<<(poVar5," did not compare ");
      this_00 = (TPZFMatrix<float> *)std::operator<<(local_1d0," number different terms ");
      A = (TPZFMatrix<float> *)std::ostream::operator<<(this_00,local_48);
      poVar5 = std::operator<<((ostream *)A," number terms ");
      std::ostream::operator<<(poVar5,*(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10));
      poVar5 = std::operator<<(local_1d0," difference in norm L1 ");
      std::ostream::operator<<(poVar5,local_3c);
      std::__cxx11::stringstream::str();
      poVar5 = std::operator<<((ostream *)&std::cout,local_210);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::stringstream::~stringstream(local_1e0);
      if ((in_DL & 1) != 0) {
        operator=(this_00,A);
      }
    }
    local_1 = local_29;
  }
  return local_1;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}